

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

DecodedResult * bech32::decode(DecodedResult *__return_storage_ptr__,string *bstring)

{
  char *pcVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer puVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  DecodedResult *pDVar8;
  int iVar9;
  uint32_t uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar11;
  runtime_error *prVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  char cVar16;
  uint uVar17;
  char *pcVar18;
  size_t __n;
  char *pcVar19;
  string *psVar20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dp;
  string dpstr;
  string hrp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  string *local_a0;
  char *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  undefined1 local_78 [16];
  pointer local_68;
  string local_58;
  DecodedResult *local_38;
  
  uVar2 = bstring->_M_string_length;
  if (uVar2 < 8) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"bech32 string too short");
    goto LAB_0010370b;
  }
  local_38 = __return_storage_ptr__;
  if (0x5a < uVar2) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"bech32 string too long");
    goto LAB_0010370b;
  }
  pcVar3 = (bstring->_M_dataplus)._M_p;
  pcVar1 = pcVar3 + uVar2;
  uVar15 = uVar2 >> 2;
  uVar17 = (uint)uVar2;
  pcVar18 = pcVar3 + (uVar17 & 0x7c);
  lVar13 = uVar15 + 1;
  pcVar19 = pcVar3 + 3;
  local_a0 = bstring;
  do {
    iVar9 = isupper((int)pcVar19[-3]);
    if (iVar9 != 0) {
      pcVar19 = pcVar19 + -3;
      goto switchD_00103054_caseD_0;
    }
    iVar9 = isupper((int)pcVar19[-2]);
    if (iVar9 != 0) {
      pcVar19 = pcVar19 + -2;
      goto switchD_00103054_caseD_0;
    }
    iVar9 = isupper((int)pcVar19[-1]);
    if (iVar9 != 0) {
      pcVar19 = pcVar19 + -1;
      goto switchD_00103054_caseD_0;
    }
    iVar9 = isupper((int)*pcVar19);
    if (iVar9 != 0) goto switchD_00103054_caseD_0;
    lVar13 = lVar13 + -1;
    pcVar19 = pcVar19 + 4;
  } while (1 < lVar13);
  pcVar14 = pcVar18;
  pcVar19 = pcVar1;
  switch(uVar17 & 3) {
  case 1:
switchD_00103054_caseD_1:
    iVar9 = isupper((int)*pcVar14);
    pcVar19 = pcVar14;
    if (iVar9 == 0) {
      pcVar19 = pcVar1;
    }
    break;
  case 2:
switchD_00103054_caseD_2:
    iVar9 = isupper((int)*pcVar14);
    pcVar19 = pcVar14;
    if (iVar9 == 0) {
      pcVar14 = pcVar14 + 1;
      goto switchD_00103054_caseD_1;
    }
    break;
  case 3:
    iVar9 = isupper((int)*pcVar18);
    pcVar19 = pcVar18;
    if (iVar9 == 0) {
      pcVar14 = pcVar18 + 1;
      goto switchD_00103054_caseD_2;
    }
  }
switchD_00103054_caseD_0:
  lVar13 = uVar15 + 1;
  pcVar14 = pcVar3 + 3;
  local_98 = pcVar18;
  do {
    iVar9 = islower((int)pcVar14[-3]);
    if (iVar9 != 0) {
      pcVar14 = pcVar14 + -3;
      goto LAB_0010316f;
    }
    iVar9 = islower((int)pcVar14[-2]);
    if (iVar9 != 0) {
      pcVar14 = pcVar14 + -2;
      goto LAB_0010316f;
    }
    iVar9 = islower((int)pcVar14[-1]);
    if (iVar9 != 0) {
      pcVar14 = pcVar14 + -1;
      goto LAB_0010316f;
    }
    iVar9 = islower((int)*pcVar14);
    pcVar18 = local_98;
    if (iVar9 != 0) goto LAB_0010316f;
    lVar13 = lVar13 + -1;
    pcVar14 = pcVar14 + 4;
  } while (1 < lVar13);
  pcVar14 = local_98;
  switch(uVar17 & 3) {
  case 0:
    goto switchD_00103116_caseD_0;
  case 1:
switchD_00103116_caseD_1:
    iVar9 = islower((int)*pcVar14);
    if (iVar9 == 0) {
      pcVar14 = pcVar1;
    }
    break;
  case 2:
switchD_00103116_caseD_2:
    iVar9 = islower((int)*pcVar14);
    if (iVar9 == 0) {
      pcVar14 = pcVar14 + 1;
      goto switchD_00103116_caseD_1;
    }
    break;
  case 3:
    iVar9 = islower((int)*local_98);
    pcVar14 = pcVar18;
    if (iVar9 == 0) {
      pcVar14 = local_98 + 1;
      goto switchD_00103116_caseD_2;
    }
  }
LAB_0010316f:
  if ((pcVar19 != pcVar1) && (pcVar14 != pcVar1)) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"bech32 string is mixed case");
    goto LAB_0010370b;
  }
switchD_00103116_caseD_0:
  psVar20 = local_a0;
  lVar13 = uVar15 + 1;
  pcVar19 = pcVar3 + 3;
  do {
    if ((byte)(pcVar19[-3] + 0x81U) < 0xa2) {
      pcVar19 = pcVar19 + -3;
      goto LAB_00103215;
    }
    if ((byte)(pcVar19[-2] + 0x81U) < 0xa2) {
      pcVar19 = pcVar19 + -2;
      goto LAB_00103215;
    }
    if ((byte)(pcVar19[-1] + 0x81U) < 0xa2) {
      pcVar19 = pcVar19 + -1;
      goto LAB_00103215;
    }
    if ((byte)(*pcVar19 + 0x81U) < 0xa2) goto LAB_00103215;
    lVar13 = lVar13 + -1;
    pcVar19 = pcVar19 + 4;
  } while (1 < lVar13);
  pcVar19 = local_98;
  switch(uVar17 & 3) {
  case 0:
    goto switchD_001031d8_caseD_0;
  case 1:
switchD_001031d8_caseD_1:
    if (0xa1 < (byte)(*pcVar19 + 0x81U)) {
      pcVar19 = pcVar1;
    }
    break;
  case 2:
switchD_001031d8_caseD_2:
    if (0xa1 < (byte)(*pcVar19 + 0x81U)) {
      pcVar19 = pcVar19 + 1;
      goto switchD_001031d8_caseD_1;
    }
    break;
  case 3:
    if (0xa1 < (byte)(*local_98 + 0x81U)) {
      pcVar19 = local_98 + 1;
      goto switchD_001031d8_caseD_2;
    }
  }
LAB_00103215:
  if (pcVar19 != pcVar1) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"bech32 string has value out of range");
    goto LAB_0010370b;
  }
switchD_001031d8_caseD_0:
  lVar13 = uVar15 + 1;
  pcVar19 = pcVar3 + 3;
  do {
    if (pcVar19[-3] == '1') {
      pcVar19 = pcVar19 + -3;
      goto LAB_00103296;
    }
    if (pcVar19[-2] == '1') {
      pcVar19 = pcVar19 + -2;
      goto LAB_00103296;
    }
    if (pcVar19[-1] == '1') {
      pcVar19 = pcVar19 + -1;
      goto LAB_00103296;
    }
    if (*pcVar19 == '1') goto LAB_00103296;
    lVar13 = lVar13 + -1;
    pcVar19 = pcVar19 + 4;
  } while (1 < lVar13);
  pcVar19 = local_98;
  switch(uVar17 & 3) {
  case 0:
    goto switchD_00103264_caseD_0;
  case 1:
switchD_00103264_caseD_1:
    if (*pcVar19 != '1') {
      pcVar19 = pcVar1;
    }
    break;
  case 2:
switchD_00103264_caseD_2:
    if (*pcVar19 != '1') {
      pcVar19 = pcVar19 + 1;
      goto switchD_00103264_caseD_1;
    }
    break;
  case 3:
    if (*local_98 != '1') {
      pcVar19 = local_98 + 1;
      goto switchD_00103264_caseD_2;
    }
  }
LAB_00103296:
  if (pcVar19 == pcVar1) {
switchD_00103264_caseD_0:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"bech32 string is missing separator character");
LAB_0010370b:
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar16 = (char)local_a0;
  std::__cxx11::string::rfind(cVar16,0x31);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar20);
  lVar13 = std::__cxx11::string::rfind(cVar16,0x31);
  std::__cxx11::string::substr((ulong)local_78,(ulong)psVar20);
  pDVar8 = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_b8,psVar20->_M_string_length - (lVar13 + 1),(allocator_type *)&local_90);
  if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78._8_8_ !=
      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    pvVar11 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    do {
      *(anon_unknown_dwarf_8497 *)
       (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + (long)pvVar11) =
           *(anon_unknown_dwarf_8497 *)(local_78._0_8_ + (long)pvVar11);
      pvVar11 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)&(pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (pvVar11 < (ulong)local_78._8_8_);
  }
  if ((anon_unknown_dwarf_8497 *)local_78._0_8_ != (anon_unknown_dwarf_8497 *)&local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_68 + 1));
  }
  anon_unknown.dwarf_8497::rejectHRPTooShort((string *)local_58._M_string_length);
  anon_unknown.dwarf_8497::rejectHRPTooLong((string *)local_58._M_string_length);
  sVar7 = local_58._M_string_length;
  _Var6._M_p = local_58._M_dataplus._M_p;
  if ((ulong)((long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 6) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"data part must be at least six characters");
LAB_0010363d:
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar4 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((string *)local_58._M_string_length != (string *)0x0) {
    psVar20 = (string *)0x0;
    do {
      iVar9 = tolower((int)_Var6._M_p[(long)psVar20]);
      _Var6._M_p[(long)psVar20] = (char)iVar9;
      psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 1);
      puVar4 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((string *)sVar7 != psVar20);
  }
  for (; puVar4 != local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    if ((long)(char)*puVar4 < 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"data part contains character value out of range");
      goto LAB_0010363d;
    }
    if ((anonymous_namespace)::reverse_charset[(char)*puVar4] == 0xff) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"data part contains invalid character");
      goto LAB_0010363d;
    }
    *puVar4 = (anonymous_namespace)::reverse_charset[(char)*puVar4];
  }
  anon_unknown.dwarf_8497::expandHrp(&local_90,&local_58);
  anon_unknown.dwarf_8497::cat
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,&local_90,&local_b8);
  uVar5 = local_78._0_8_;
  uVar10 = anon_unknown.dwarf_8497::polymod
                     ((anon_unknown_dwarf_8497 *)local_78._0_8_,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78._8_8_);
  if ((anon_unknown_dwarf_8497 *)uVar5 != (anon_unknown_dwarf_8497 *)0x0) {
    operator_delete((void *)uVar5,(long)local_68 - uVar5);
  }
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar10 == 0x2bc830a3) {
    local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + -6;
    pDVar8->encoding = Bech32m;
    (pDVar8->hrp)._M_dataplus._M_p = (pointer)&(pDVar8->hrp).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pDVar8->hrp,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + (long)(_Alloc_hider *)local_58._M_string_length);
    (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              (&(pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    anon_unknown.dwarf_8497::expandHrp(&local_90,&local_58);
    anon_unknown.dwarf_8497::cat
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,&local_90,&local_b8
              );
    uVar10 = anon_unknown.dwarf_8497::polymod
                       ((anon_unknown_dwarf_8497 *)local_78._0_8_,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78._8_8_);
    if ((anon_unknown_dwarf_8497 *)local_78._0_8_ != (anon_unknown_dwarf_8497 *)0x0) {
      operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
    }
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (uVar10 != 1) {
      *(undefined8 *)pDVar8 = 0;
      (pDVar8->hrp)._M_dataplus._M_p = (pointer)0x0;
      (pDVar8->hrp)._M_string_length = 0;
      (pDVar8->hrp).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(pDVar8->hrp).field_2 + 8) = 0;
      (pDVar8->hrp)._M_dataplus._M_p = (pointer)&(pDVar8->hrp).field_2;
      (pDVar8->hrp).field_2._M_local_buf[0] = '\0';
      (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_001035b6;
    }
    local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + -6;
    pDVar8->encoding = Bech32;
    (pDVar8->hrp)._M_dataplus._M_p = (pointer)&(pDVar8->hrp).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pDVar8->hrp,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + (long)(_Alloc_hider *)local_58._M_string_length);
    (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              (&(pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  puVar4 = (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(puVar4,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
  }
  (pDVar8->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar4 + __n;
LAB_001035b6:
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return pDVar8;
}

Assistant:

DecodedResult decode(const std::string & bstring) {
        rejectBStringThatIsntWellFormed(bstring);
        std::string hrp = extractHumanReadablePart(bstring);
        std::vector<unsigned char> dp = extractDataPart(bstring);
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectDPTooShort(dp);
        convertToLowercase(hrp);
        mapDP(dp);
        if (verifyChecksum(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32m, hrp, dp};
        }
        else if (verifyChecksumUsingOriginalConstant(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32, hrp, dp};
        }
        else {
            return DecodedResult();
        }
    }